

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O2

void __thiscall slang::Bag::set<slang::parsing::ParserOptions&>(Bag *this,ParserOptions *item)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  size_t hash;
  byte bVar8;
  ulong uVar9;
  value_type_pointer __rhs;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong pos0;
  undefined1 auVar13 [16];
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  byte bVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  byte bVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  byte bVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  byte bVar29;
  try_emplace_args_t local_99;
  type_index local_98;
  ulong local_90;
  size_t local_88;
  ulong local_80;
  ulong local_78;
  ParserOptions *local_70;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  local_98._M_target = (type_info *)&parsing::ParserOptions::typeinfo;
  local_70 = item;
  hash = boost::unordered::detail::foa::mulx_mix::
         mix<slang::hash<std::type_index,void>,std::type_index>
                   ((hash<std::type_index,_void> *)this,&local_98);
  pos0 = hash >> ((byte)(this->items).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                        .arrays.groups_size_index & 0x3f);
  lVar10 = (hash & 0xff) * 4;
  uVar14 = (&UNK_0040eb5c)[lVar10];
  uVar15 = (&UNK_0040eb5d)[lVar10];
  uVar16 = (&UNK_0040eb5e)[lVar10];
  bVar17 = (&UNK_0040eb5f)[lVar10];
  uVar12 = (ulong)((uint)hash & 7);
  uVar9 = 0;
  uVar11 = pos0;
  uVar18 = uVar14;
  uVar19 = uVar15;
  uVar20 = uVar16;
  bVar21 = bVar17;
  uVar22 = uVar14;
  uVar23 = uVar15;
  uVar24 = uVar16;
  bVar25 = bVar17;
  uVar26 = uVar14;
  uVar27 = uVar15;
  uVar28 = uVar16;
  bVar29 = bVar17;
  do {
    pgVar2 = (this->items).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar11;
    local_58 = pgVar1->m[0].n;
    uStack_57 = pgVar1->m[1].n;
    uStack_56 = pgVar1->m[2].n;
    bStack_55 = pgVar1->m[3].n;
    uStack_54 = pgVar1->m[4].n;
    uStack_53 = pgVar1->m[5].n;
    uStack_52 = pgVar1->m[6].n;
    bStack_51 = pgVar1->m[7].n;
    uStack_50 = pgVar1->m[8].n;
    uStack_4f = pgVar1->m[9].n;
    uStack_4e = pgVar1->m[10].n;
    bStack_4d = pgVar1->m[0xb].n;
    uStack_4c = pgVar1->m[0xc].n;
    uStack_4b = pgVar1->m[0xd].n;
    uStack_4a = pgVar1->m[0xe].n;
    bVar8 = pgVar1->m[0xf].n;
    auVar13[0] = -(local_58 == uVar14);
    auVar13[1] = -(uStack_57 == uVar15);
    auVar13[2] = -(uStack_56 == uVar16);
    auVar13[3] = -(bStack_55 == bVar17);
    auVar13[4] = -(uStack_54 == uVar18);
    auVar13[5] = -(uStack_53 == uVar19);
    auVar13[6] = -(uStack_52 == uVar20);
    auVar13[7] = -(bStack_51 == bVar21);
    auVar13[8] = -(uStack_50 == uVar22);
    auVar13[9] = -(uStack_4f == uVar23);
    auVar13[10] = -(uStack_4e == uVar24);
    auVar13[0xb] = -(bStack_4d == bVar25);
    auVar13[0xc] = -(uStack_4c == uVar26);
    auVar13[0xd] = -(uStack_4b == uVar27);
    auVar13[0xe] = -(uStack_4a == uVar28);
    auVar13[0xf] = -(bVar8 == bVar29);
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
    bStack_49 = bVar8;
    if (uVar7 != 0) {
      ppVar3 = (this->items).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
               .arrays.elements_;
      local_90 = uVar12;
      local_88 = hash;
      local_80 = uVar11;
      local_78 = uVar9;
      local_68 = uVar14;
      uStack_67 = uVar15;
      uStack_66 = uVar16;
      bStack_65 = bVar17;
      uStack_64 = uVar18;
      uStack_63 = uVar19;
      uStack_62 = uVar20;
      bStack_61 = bVar21;
      uStack_60 = uVar22;
      uStack_5f = uVar23;
      uStack_5e = uVar24;
      bStack_5d = bVar25;
      uStack_5c = uVar26;
      uStack_5b = uVar27;
      uStack_5a = uVar28;
      bStack_59 = bVar29;
      do {
        uVar5 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        __rhs = ppVar3 + uVar11 * 0xf + (ulong)uVar5;
        bVar6 = std::type_index::operator==(&local_98,&__rhs->first);
        if (bVar6) goto LAB_0016d704;
        uVar7 = uVar7 - 1 & uVar7;
      } while (uVar7 != 0);
      bVar8 = pgVar2[uVar11].m[0xf].n;
      hash = local_88;
      uVar9 = local_78;
      uVar11 = local_80;
      uVar12 = local_90;
      uVar14 = local_68;
      uVar15 = uStack_67;
      uVar16 = uStack_66;
      bVar17 = bStack_65;
      uVar18 = uStack_64;
      uVar19 = uStack_63;
      uVar20 = uStack_62;
      bVar21 = bStack_61;
      uVar22 = uStack_60;
      uVar23 = uStack_5f;
      uVar24 = uStack_5e;
      bVar25 = bStack_5d;
      uVar26 = uStack_5c;
      uVar27 = uStack_5b;
      uVar28 = uStack_5a;
      bVar29 = bStack_59;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar12] & bVar8) == 0) break;
    uVar4 = (this->items).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
            .arrays.groups_size_mask;
    lVar10 = uVar11 + uVar9;
    uVar9 = uVar9 + 1;
    uVar11 = lVar10 + 1U & uVar4;
  } while (uVar9 <= uVar4);
  if ((this->items).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
      .size_ctrl.size <
      (this->items).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
    ::unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                *)this,pos0,hash,&local_99,&local_98);
    __rhs = local_48.p;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                *)this,hash,&local_99,&local_98);
    __rhs = local_48.p;
  }
LAB_0016d704:
  std::any::operator=(&__rhs->second,local_70);
  return;
}

Assistant:

void set(T&& item) {
        items[SLANG_TYPEOF(T)] = std::forward<T>(item);
    }